

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall HighsSparseMatrix::applyColScale(HighsSparseMatrix *this,HighsScale *scale)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer piVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  if (this->format_ == kColwise) {
    iVar1 = this->num_col_;
    if (0 < (long)iVar1) {
      piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      iVar8 = *piVar3;
      do {
        iVar2 = piVar3[lVar9 + 1];
        if (iVar8 < iVar2) {
          lVar10 = (long)iVar8;
          do {
            pdVar4[lVar10] = pdVar5[lVar9] * pdVar4[lVar10];
            lVar10 = lVar10 + 1;
          } while (iVar2 != lVar10);
        }
        lVar9 = lVar9 + 1;
        iVar8 = iVar2;
      } while (lVar9 != iVar1);
    }
  }
  else {
    iVar1 = this->num_row_;
    if (0 < (long)iVar1) {
      piVar6 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      iVar8 = *piVar6;
      do {
        iVar2 = piVar6[lVar9 + 1];
        if (iVar8 < iVar2) {
          lVar10 = (long)iVar8;
          do {
            pdVar5[lVar10] = pdVar4[piVar7[lVar10]] * pdVar5[lVar10];
            lVar10 = lVar10 + 1;
          } while (iVar2 != lVar10);
        }
        lVar9 = lVar9 + 1;
        iVar8 = iVar2;
      } while (lVar9 != iVar1);
    }
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}